

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O1

int lj_cf_debug_traceback(lua_State *L)

{
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  int32_t level;
  char *msg;
  TValue *pTVar2;
  uint uVar3;
  lua_State *L1;
  
  uVar3 = 0;
  L1 = L;
  if ((L->base < L->top) && (aVar1 = L->base->field_4, aVar1.it >> 0xf == 0x1fff9)) {
    uVar3 = 1;
    L1 = (lua_State *)((ulong)aVar1 & 0x7fffffffffff);
  }
  msg = lua_tolstring(L,uVar3 + 1,(size_t *)0x0);
  if ((msg == (char *)0x0) &&
     (pTVar2 = (TValue *)((ulong)(uVar3 * 8) + (long)L->base), pTVar2 < L->top)) {
    L->top = pTVar2 + 1;
  }
  else {
    level = lj_lib_optint(L,uVar3 | 2,(uint)(L1 == L));
    luaL_traceback(L,L1,msg,level);
  }
  return 1;
}

Assistant:

LJLIB_CF(debug_traceback)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *msg = lua_tostring(L, arg+1);
  if (msg == NULL && L->top > L->base+arg)
    L->top = L->base+arg+1;
  else
    luaL_traceback(L, L1, msg, lj_lib_optint(L, arg+2, (L == L1)));
  return 1;
}